

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

Mvc_Cover_t *
Mvc_CoverUnivQuantify(Mvc_Cover_t *p,int iValueA0,int iValueA1,int iValueB0,int iValueB1)

{
  byte bVar1;
  byte bVar2;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  Mvc_List_t *pList;
  int ValueB1;
  int ValueB0;
  int ValueA1;
  int ValueA0;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover;
  int iValueB1_local;
  int iValueB0_local;
  int iValueA1_local;
  int iValueA0_local;
  Mvc_Cover_t *p_local;
  
  pCover_00 = Mvc_CoverClone(p);
  pCubeCopy = (p->lCubes).pHead;
  while( true ) {
    if (pCubeCopy == (Mvc_Cube_t *)0x0) {
      return pCover_00;
    }
    iVar4 = iValueA0 >> 5;
    bVar1 = (byte)iValueA0;
    bVar8 = (pCubeCopy->pData[iVar4] & 1 << (bVar1 & 0x1f)) != 0;
    iVar5 = iValueA1 >> 5;
    bVar2 = (byte)iValueA1;
    bVar9 = (pCubeCopy->pData[iVar5] & 1 << (bVar2 & 0x1f)) != 0;
    iVar6 = iValueB0 >> 5;
    bVar10 = (pCubeCopy->pData[iVar6] & 1 << ((byte)iValueB0 & 0x1f)) != 0;
    iVar7 = iValueB1 >> 5;
    bVar11 = (pCubeCopy->pData[iVar7] & 1 << ((byte)iValueB1 & 0x1f)) != 0;
    if ((!bVar8) && (!bVar9)) break;
    if ((!bVar10) && (!bVar11)) {
      __assert_fail("ValueB0 || ValueB1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mvc/mvcUtils.c"
                    ,0x272,"Mvc_Cover_t *Mvc_CoverUnivQuantify(Mvc_Cover_t *, int, int, int, int)");
    }
    if ((bVar8 == bVar10) || (bVar9 == bVar11)) {
      pMVar3 = Mvc_CubeDup(pCover_00,pCubeCopy);
      if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
        (pCover_00->lCubes).pHead = pMVar3;
      }
      else {
        ((pCover_00->lCubes).pTail)->pNext = pMVar3;
      }
      (pCover_00->lCubes).pTail = pMVar3;
      pMVar3->pNext = (Mvc_Cube_t *)0x0;
      (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
      if ((bVar8) && (bVar10)) {
        pMVar3->pData[iVar4] = 1 << (bVar1 & 0x1f) | pMVar3->pData[iVar4];
      }
      else {
        pMVar3->pData[iVar4] = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & pMVar3->pData[iVar4];
      }
      if ((bVar9) && (bVar11)) {
        pMVar3->pData[iVar5] = 1 << (bVar2 & 0x1f) | pMVar3->pData[iVar5];
      }
      else {
        pMVar3->pData[iVar5] = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & pMVar3->pData[iVar5];
      }
      pMVar3->pData[iVar6] = 1 << ((byte)iValueB0 & 0x1f) | pMVar3->pData[iVar6];
      pMVar3->pData[iVar7] = 1 << ((byte)iValueB1 & 0x1f) | pMVar3->pData[iVar7];
    }
    pCubeCopy = pCubeCopy->pNext;
  }
  __assert_fail("ValueA0 || ValueA1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mvc/mvcUtils.c"
                ,0x271,"Mvc_Cover_t *Mvc_CoverUnivQuantify(Mvc_Cover_t *, int, int, int, int)");
}

Assistant:

Mvc_Cover_t * Mvc_CoverUnivQuantify( Mvc_Cover_t * p, 
    int iValueA0, int iValueA1, int iValueB0, int iValueB1 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    int ValueA0, ValueA1, ValueB0, ValueB1;

    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        // get the bits
        ValueA0 = Mvc_CubeBitValue( pCube, iValueA0 );
        ValueA1 = Mvc_CubeBitValue( pCube, iValueA1 );
        ValueB0 = Mvc_CubeBitValue( pCube, iValueB0 );
        ValueB1 = Mvc_CubeBitValue( pCube, iValueB1 );

        // cannot be both zero because they belong to the same var
        assert( ValueA0 || ValueA1 ); 
        assert( ValueB0 || ValueB1 ); 

        // if the values of this var are different, do not add the cube
        if ( ValueA0 != ValueB0 && ValueA1 != ValueB1 )
            continue;

        // create the cube
        pCubeCopy = Mvc_CubeDup( pCover, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );

        // insert 1's into for the first var, if both have this value
        if ( ValueA0 && ValueB0 )
            Mvc_CubeBitInsert( pCubeCopy, iValueA0 );
        else
            Mvc_CubeBitRemove( pCubeCopy, iValueA0 );

        if ( ValueA1 && ValueB1 )
            Mvc_CubeBitInsert( pCubeCopy, iValueA1 );
        else
            Mvc_CubeBitRemove( pCubeCopy, iValueA1 );
            
        // insert 1's into for the second var (the cover does not depend on it)
        Mvc_CubeBitInsert( pCubeCopy, iValueB0 );
        Mvc_CubeBitInsert( pCubeCopy, iValueB1 );
    }
    return pCover;
}